

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O1

String * __thiscall cm::String::erase(String *this,size_type index,size_type count)

{
  ulong uVar1;
  ulong uVar2;
  type pSVar3;
  out_of_range *this_00;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = (this->view_)._M_len;
  uVar2 = uVar1 - index;
  if (index <= uVar1) {
    if (uVar2 < count) {
      count = uVar2;
    }
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::reserve((ulong)&local_40);
    std::__cxx11::string::_M_replace
              ((ulong)&local_40,0,(char *)local_40._M_string_length,(ulong)(this->view_)._M_str);
    std::__cxx11::string::append((char *)&local_40,(ulong)((this->view_)._M_str + count + index));
    pSVar3 = operator=(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    return pSVar3;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Index out of range in String::erase");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

String& String::erase(size_type index, size_type count)
{
  if (index > this->size()) {
    throw std::out_of_range("Index out of range in String::erase");
  }
  size_type const rcount = std::min(count, this->size() - index);
  size_type const rindex = index + rcount;
  std::string s;
  s.reserve(this->size() - rcount);
  s.assign(this->data(), index);
  s.append(this->data() + rindex, this->size() - rindex);
  return *this = std::move(s);
}